

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::compile(Shader *this,char *vertexShaderCode,char *geometryShaderCode,
                   char *fragmentShaderCode)

{
  bool bVar1;
  ostream *poVar2;
  GLcharARB *in_RCX;
  GLcharARB *in_RDX;
  GLcharARB *in_RSI;
  GLhandleARB *in_RDI;
  char log_3 [1024];
  GLint success;
  char log_2 [1024];
  GLint success_3;
  GLhandleARB fragmentShader;
  char log_1 [1024];
  GLint success_2;
  GLhandleARB geometryShader;
  char log [1024];
  GLint success_1;
  GLhandleARB vertexShader;
  GLhandleARB shaderProgram;
  TransientContextLock lock;
  ostream *in_stack_ffffffffffffeea0;
  TransientContextLock *in_stack_ffffffffffffeeb0;
  GLcharARB local_1088 [1036];
  int local_c7c;
  GLcharARB local_c78 [1032];
  int local_870;
  GLhandleARB local_86c;
  GLcharARB local_868 [1032];
  int local_460;
  GLhandleARB local_45c;
  GLcharARB local_458 [1036];
  int local_4c;
  GLhandleARB local_48;
  GLhandleARB local_44;
  undefined4 local_40;
  GLcharARB *local_28;
  GLcharARB *local_20;
  GLcharARB *local_18 [2];
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffeeb0);
  bVar1 = isAvailable();
  if (bVar1) {
    if (local_20 != (GLcharARB *)0x0) {
      bVar1 = isGeometryAvailable();
      if (!bVar1) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,
                                 "Failed to create a shader: your system doesn\'t support geometry shaders "
                                );
        poVar2 = std::operator<<(poVar2,
                                 "(you should test Shader::isGeometryAvailable() before trying to use geometry shaders)"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        goto LAB_001f7d5a;
      }
    }
    if (*in_RDI != 0) {
      (*sf_glad_glDeleteObjectARB)(*in_RDI);
      *in_RDI = 0;
    }
    in_RDI[1] = 0xffffffff;
    std::
    map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
    ::clear((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
             *)0x1f7710);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x1f7721);
    local_44 = (*sf_glad_glCreateProgramObjectARB)();
    if (local_18[0] != (GLcharARB *)0x0) {
      local_48 = (*sf_glad_glCreateShaderObjectARB)(0x8b31);
      (*sf_glad_glShaderSourceARB)(local_48,1,local_18,(GLint *)0x0);
      (*sf_glad_glCompileShaderARB)(local_48);
      (*sf_glad_glGetObjectParameterivARB)(local_48,0x8b81,&local_4c);
      if (local_4c == 0) {
        (*sf_glad_glGetInfoLogARB)(local_48,0x400,(GLsizei *)0x0,local_458);
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to compile vertex shader:");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,local_458);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        (*sf_glad_glDeleteObjectARB)(local_48);
        (*sf_glad_glDeleteObjectARB)(local_44);
        local_1 = 0;
        goto LAB_001f7d5a;
      }
      (*sf_glad_glAttachObjectARB)(local_44,local_48);
      (*sf_glad_glDeleteObjectARB)(local_48);
    }
    if (local_20 != (GLcharARB *)0x0) {
      local_45c = (*sf_glad_glCreateShaderObjectARB)(0x8dd9);
      (*sf_glad_glShaderSourceARB)(local_45c,1,&local_20,(GLint *)0x0);
      (*sf_glad_glCompileShaderARB)(local_45c);
      (*sf_glad_glGetObjectParameterivARB)(local_45c,0x8b81,&local_460);
      if (local_460 == 0) {
        (*sf_glad_glGetInfoLogARB)(local_45c,0x400,(GLsizei *)0x0,local_868);
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to compile geometry shader:");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,local_868);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        (*sf_glad_glDeleteObjectARB)(local_45c);
        (*sf_glad_glDeleteObjectARB)(local_44);
        local_1 = 0;
        goto LAB_001f7d5a;
      }
      (*sf_glad_glAttachObjectARB)(local_44,local_45c);
      (*sf_glad_glDeleteObjectARB)(local_45c);
    }
    if (local_28 != (GLcharARB *)0x0) {
      local_86c = (*sf_glad_glCreateShaderObjectARB)(0x8b30);
      (*sf_glad_glShaderSourceARB)(local_86c,1,&local_28,(GLint *)0x0);
      (*sf_glad_glCompileShaderARB)(local_86c);
      (*sf_glad_glGetObjectParameterivARB)(local_86c,0x8b81,&local_870);
      if (local_870 == 0) {
        (*sf_glad_glGetInfoLogARB)(local_86c,0x400,(GLsizei *)0x0,local_c78);
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to compile fragment shader:");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,local_c78);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        (*sf_glad_glDeleteObjectARB)(local_86c);
        (*sf_glad_glDeleteObjectARB)(local_44);
        local_1 = 0;
        goto LAB_001f7d5a;
      }
      (*sf_glad_glAttachObjectARB)(local_44,local_86c);
      (*sf_glad_glDeleteObjectARB)(local_86c);
    }
    (*sf_glad_glLinkProgramARB)(local_44);
    (*sf_glad_glGetObjectParameterivARB)(local_44,0x8b82,&local_c7c);
    if (local_c7c == 0) {
      (*sf_glad_glGetInfoLogARB)(local_44,0x400,(GLsizei *)0x0,local_1088);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to link shader:");
      in_stack_ffffffffffffeea0 =
           (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(in_stack_ffffffffffffeea0,local_1088);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      (*sf_glad_glDeleteObjectARB)(local_44);
      local_1 = 0;
    }
    else {
      *in_RDI = local_44;
      (*sf_glad_glFlush)();
      local_1 = 1;
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Failed to create a shader: your system doesn\'t support shaders ");
    poVar2 = std::operator<<(poVar2,
                             "(you should test Shader::isAvailable() before trying to use the Shader class)"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
LAB_001f7d5a:
  local_40 = 1;
  GlResource::TransientContextLock::~TransientContextLock
            ((TransientContextLock *)in_stack_ffffffffffffeea0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::compile(const char* vertexShaderCode, const char* geometryShaderCode, const char* fragmentShaderCode)
{
    TransientContextLock lock;

    // First make sure that we can use shaders
    if (!isAvailable())
    {
        err() << "Failed to create a shader: your system doesn't support shaders "
              << "(you should test Shader::isAvailable() before trying to use the Shader class)" << std::endl;
        return false;
    }

    // Make sure we can use geometry shaders
    if (geometryShaderCode && !isGeometryAvailable())
    {
        err() << "Failed to create a shader: your system doesn't support geometry shaders "
              << "(you should test Shader::isGeometryAvailable() before trying to use geometry shaders)" << std::endl;
        return false;
    }

    // Destroy the shader if it was already created
    if (m_shaderProgram)
    {
        glCheck(GLEXT_glDeleteObject(castToGlHandle(m_shaderProgram)));
        m_shaderProgram = 0;
    }

    // Reset the internal state
    m_currentTexture = -1;
    m_textures.clear();
    m_uniforms.clear();

    // Create the program
    GLEXT_GLhandle shaderProgram;
    glCheck(shaderProgram = GLEXT_glCreateProgramObject());

    // Create the vertex shader if needed
    if (vertexShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle vertexShader;
        glCheck(vertexShader = GLEXT_glCreateShaderObject(GLEXT_GL_VERTEX_SHADER));
        glCheck(GLEXT_glShaderSource(vertexShader, 1, &vertexShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(vertexShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(vertexShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(vertexShader, sizeof(log), 0, log));
            err() << "Failed to compile vertex shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(vertexShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, vertexShader));
        glCheck(GLEXT_glDeleteObject(vertexShader));
    }

    // Create the geometry shader if needed
    if (geometryShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle geometryShader = GLEXT_glCreateShaderObject(GLEXT_GL_GEOMETRY_SHADER);
        glCheck(GLEXT_glShaderSource(geometryShader, 1, &geometryShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(geometryShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(geometryShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(geometryShader, sizeof(log), 0, log));
            err() << "Failed to compile geometry shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(geometryShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, geometryShader));
        glCheck(GLEXT_glDeleteObject(geometryShader));
    }

    // Create the fragment shader if needed
    if (fragmentShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle fragmentShader;
        glCheck(fragmentShader = GLEXT_glCreateShaderObject(GLEXT_GL_FRAGMENT_SHADER));
        glCheck(GLEXT_glShaderSource(fragmentShader, 1, &fragmentShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(fragmentShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(fragmentShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(fragmentShader, sizeof(log), 0, log));
            err() << "Failed to compile fragment shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(fragmentShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, fragmentShader));
        glCheck(GLEXT_glDeleteObject(fragmentShader));
    }

    // Link the program
    glCheck(GLEXT_glLinkProgram(shaderProgram));

    // Check the link log
    GLint success;
    glCheck(GLEXT_glGetObjectParameteriv(shaderProgram, GLEXT_GL_OBJECT_LINK_STATUS, &success));
    if (success == GL_FALSE)
    {
        char log[1024];
        glCheck(GLEXT_glGetInfoLog(shaderProgram, sizeof(log), 0, log));
        err() << "Failed to link shader:" << std::endl
              << log << std::endl;
        glCheck(GLEXT_glDeleteObject(shaderProgram));
        return false;
    }

    m_shaderProgram = castFromGlHandle(shaderProgram);

    // Force an OpenGL flush, so that the shader will appear updated
    // in all contexts immediately (solves problems in multi-threaded apps)
    glCheck(glFlush());

    return true;
}